

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_optimizer.cpp
# Opt level: O3

void glslopt_shader_get_input_desc
               (glslopt_shader *shader,int index,char **outName,glslopt_basic_type *outType,
               glslopt_precision *outPrec,int *outVecSize,int *outMatSize,int *outArraySize,
               int *outLocation)

{
  *outName = shader->inputs[index].name;
  *outType = shader->inputs[index].type;
  *outPrec = shader->inputs[index].prec;
  *outVecSize = shader->inputs[index].vectorSize;
  *outMatSize = shader->inputs[index].matrixSize;
  *outArraySize = shader->inputs[index].arraySize;
  *outLocation = shader->inputs[index].location;
  return;
}

Assistant:

void glslopt_shader_get_input_desc (glslopt_shader* shader, int index, const char** outName, glslopt_basic_type* outType, glslopt_precision* outPrec, int* outVecSize, int* outMatSize, int* outArraySize, int* outLocation)
{
	const glslopt_shader_var& v = shader->inputs[index];
	*outName = v.name;
	*outType = v.type;
	*outPrec = v.prec;
	*outVecSize = v.vectorSize;
	*outMatSize = v.matrixSize;
	*outArraySize = v.arraySize;
	*outLocation = v.location;
}